

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Compiler::processIF(Compiler *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *line)

{
  uint uVar1;
  string local_30;
  
  Scope::reset(&this->expectedScopeType);
  uVar1 = (uint)((ulong)((long)(this->bytecode).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->bytecode).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  (this->expectedScopeType).bytecodeSizeBefore = uVar1;
  (this->expectedScopeType).statementPos = uVar1;
  std::__cxx11::string::string
            ((string *)&local_30,
             (string *)
             ((line->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 1));
  evaluateBracket(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  InstructionGenerator::genConditionalIf(&this->igen,0);
  (this->expectedScopeType).type = IF;
  return;
}

Assistant:

void Compiler::processIF(const std::vector<std::string>& line)
{
    //Reset the expected scope
    expectedScopeType.reset();

    //Store the bytecode size before the statement
    expectedScopeType.bytecodeSizeBefore = bytecode.size();

    //And the other stuff
    expectedScopeType.statementPos = bytecode.size();
    evaluateBracket(line[1]);
    igen.genConditionalIf(0); //Skip pos will be set later once the scope end point is known
    expectedScopeType.type = Scope::IF;
}